

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O1

bool __thiscall
node::anon_unknown_2::ChainImpl::updateRwSetting
          (ChainImpl *this,string *name,SettingsUpdate *update_settings_func)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
  *this_00;
  ArgsManager *pAVar1;
  bool bVar2;
  ArgsManager **ppAVar3;
  iterator iVar4;
  UniValue *pUVar5;
  optional<interfaces::SettingsAction> oVar6;
  undefined8 uVar7;
  long in_FS_OFFSET;
  unique_lock<std::recursive_mutex> local_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  ppAVar3 = inline_assertion_check<true,ArgsManager*&>
                      (&this->m_node->args,
                       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/interfaces.cpp"
                       ,0x35c,"args","m_node.args");
  pAVar1 = *ppAVar3;
  local_40._M_owns = false;
  local_40._M_device = (mutex_type *)pAVar1;
  std::unique_lock<std::recursive_mutex>::lock(&local_40);
  this_00 = &(pAVar1->m_settings).rw_settings;
  iVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
          ::find(&this_00->_M_t,name);
  pUVar5 = (UniValue *)(iVar4._M_node + 2);
  if ((_Rb_tree_header *)iVar4._M_node ==
      &(pAVar1->m_settings).rw_settings._M_t._M_impl.super__Rb_tree_header) {
    pUVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
             ::operator[](this_00,name);
  }
  if ((update_settings_func->super__Function_base)._M_manager == (_Manager_type)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      uVar7 = std::__throw_bad_function_call();
      std::unique_lock<std::recursive_mutex>::~unique_lock(&local_40);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        _Unwind_Resume(uVar7);
      }
    }
  }
  else {
    oVar6 = (*update_settings_func->_M_invoker)((_Any_data *)update_settings_func,pUVar5);
    std::unique_lock<std::recursive_mutex>::~unique_lock(&local_40);
    if (((ulong)oVar6.super__Optional_base<interfaces::SettingsAction,_true,_true>._M_payload.
                super__Optional_payload_base<interfaces::SettingsAction> >> 0x20 & 1) == 0) {
      bVar2 = false;
    }
    else {
      bVar2 = true;
      if (oVar6.super__Optional_base<interfaces::SettingsAction,_true,_true>._M_payload.
          super__Optional_payload_base<interfaces::SettingsAction>._M_payload != SKIP_WRITE) {
        ppAVar3 = inline_assertion_check<true,ArgsManager*&>
                            (&this->m_node->args,
                             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/interfaces.cpp"
                             ,0x35c,"args","m_node.args");
        bVar2 = ArgsManager::WriteSettingsFile
                          (*ppAVar3,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)0x0,false);
      }
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      return bVar2;
    }
  }
  __stack_chk_fail();
}

Assistant:

bool updateRwSetting(const std::string& name,
                         const interfaces::SettingsUpdate& update_settings_func) override
    {
        std::optional<interfaces::SettingsAction> action;
        args().LockSettings([&](common::Settings& settings) {
            auto* ptr_value = common::FindKey(settings.rw_settings, name);
            // Create value if it doesn't exist
            auto& value = ptr_value ? *ptr_value : settings.rw_settings[name];
            action = update_settings_func(value);
        });
        if (!action) return false;
        // Now dump value to disk if requested
        return *action == interfaces::SettingsAction::SKIP_WRITE || args().WriteSettingsFile();
    }